

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O0

void If_CutFoundFanins_rec(If_Obj_t *pObj,Vec_Int_t *vLeaves)

{
  int iVar1;
  If_Obj_t *pIVar2;
  Vec_Int_t *vLeaves_local;
  If_Obj_t *pObj_local;
  
  if ((pObj->nRefs == 0) && (iVar1 = If_ObjIsCi(pObj), iVar1 == 0)) {
    pIVar2 = If_ObjFanin0(pObj);
    If_CutFoundFanins_rec(pIVar2,vLeaves);
    pIVar2 = If_ObjFanin1(pObj);
    If_CutFoundFanins_rec(pIVar2,vLeaves);
    return;
  }
  Vec_IntPushUnique(vLeaves,pObj->Id);
  return;
}

Assistant:

void If_CutFoundFanins_rec( If_Obj_t * pObj, Vec_Int_t * vLeaves )
{
    if ( pObj->nRefs || If_ObjIsCi(pObj) )
    {
        Vec_IntPushUnique( vLeaves, pObj->Id );
        return;
    }
    If_CutFoundFanins_rec( If_ObjFanin0(pObj), vLeaves );
    If_CutFoundFanins_rec( If_ObjFanin1(pObj), vLeaves );
}